

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CGL::Matrix3x3::inv(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double dVar5;
  Matrix3x3 *A;
  Matrix3x3 *this_local;
  Matrix3x3 *B;
  
  Matrix3x3(__return_storage_ptr__);
  pdVar4 = operator()(this,1,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,1);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,1,1);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,0,0);
  *pdVar4 = -dVar5 * dVar1 + dVar2 * dVar3;
  pdVar4 = operator()(this,0,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,1);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,1);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,0,1);
  *pdVar4 = dVar5 * dVar1 + -(dVar2 * dVar3);
  pdVar4 = operator()(this,0,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,1,1);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,1);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,1,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,0,2);
  *pdVar4 = -dVar5 * dVar1 + dVar2 * dVar3;
  pdVar4 = operator()(this,1,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,1,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,1,0);
  *pdVar4 = dVar5 * dVar1 + -(dVar2 * dVar3);
  pdVar4 = operator()(this,0,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,1,1);
  *pdVar4 = -dVar5 * dVar1 + dVar2 * dVar3;
  pdVar4 = operator()(this,0,2);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,1,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,1,2);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,1,2);
  *pdVar4 = dVar5 * dVar1 + -(dVar2 * dVar3);
  pdVar4 = operator()(this,1,1);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,1,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,1);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,2,0);
  *pdVar4 = -dVar5 * dVar1 + dVar2 * dVar3;
  pdVar4 = operator()(this,0,1);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,2,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,2,1);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,2,1);
  *pdVar4 = dVar5 * dVar1 + -(dVar2 * dVar3);
  pdVar4 = operator()(this,0,1);
  dVar5 = *pdVar4;
  pdVar4 = operator()(this,1,0);
  dVar1 = *pdVar4;
  pdVar4 = operator()(this,0,0);
  dVar2 = *pdVar4;
  pdVar4 = operator()(this,1,1);
  dVar3 = *pdVar4;
  pdVar4 = operator()(__return_storage_ptr__,2,2);
  *pdVar4 = -dVar5 * dVar1 + dVar2 * dVar3;
  dVar5 = det(this);
  operator/=(__return_storage_ptr__,dVar5);
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::inv( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B(0,0) = -A(1,2)*A(2,1) + A(1,1)*A(2,2); B(0,1) =  A(0,2)*A(2,1) - A(0,1)*A(2,2); B(0,2) = -A(0,2)*A(1,1) + A(0,1)*A(1,2);
    B(1,0) =  A(1,2)*A(2,0) - A(1,0)*A(2,2); B(1,1) = -A(0,2)*A(2,0) + A(0,0)*A(2,2); B(1,2) =  A(0,2)*A(1,0) - A(0,0)*A(1,2);
    B(2,0) = -A(1,1)*A(2,0) + A(1,0)*A(2,1); B(2,1) =  A(0,1)*A(2,0) - A(0,0)*A(2,1); B(2,2) = -A(0,1)*A(1,0) + A(0,0)*A(1,1);

    B /= det();

    return B;
  }